

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
::ComputeInitialStepLength
          (BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::SinhId>_>
           *this,double x0)

{
  double extraout_XMM0_Qa;
  double dVar1;
  double dVar2;
  
  (*this->_vptr_BasicPLApproximator[0xd])();
  if (1e-100 <= ABS(extraout_XMM0_Qa)) {
    dVar1 = ABS(((this->laPrm_->ubErr * 8.0) / 3.0) / extraout_XMM0_Qa);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar2 = ub_sub(this);
    if (dVar2 < dVar1 + x0) {
      dVar1 = ub_sub(this);
      dVar1 = dVar1 - x0;
    }
    if (1e-10 <= dVar1) {
      return dVar1;
    }
  }
  dVar1 = ub_sub(this);
  return (dVar1 - x0) / 100.0;
}

Assistant:

double BasicPLApproximator<FuncCon>::ComputeInitialStepLength(
    double x0) {
  /// Quadratic approximation from current left point
  auto f2 = eval_2nd(x0);             // f''(x0)
  if (std::fabs(f2)<1e-100)           // cannot do,
    return (ub_sub()-x0)/100;         // return interval/100
  /// Initial step
  auto dx0 = std::sqrt(
        std::fabs(laPrm_.ubErr * 8.0 / 3.0 / f2) );
  if (x0+dx0 > ub_sub())
    dx0 = ub_sub()-x0;
  if (dx0<1e-10)
    dx0 = (ub_sub()-x0) / 100.0;
  return dx0;
}